

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<long_long>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>
               (GetterYs<long_long> *getter1,GetterYRef *getter2,TransformerLinLin *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  float fVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *gp;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  ImU32 local_70;
  float local_6c;
  ImDrawList *local_68;
  double local_60;
  LineSegmentsRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
  local_58;
  
  pIVar7 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_58.Prims = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_58.Prims = getter1->Count;
    }
    local_58.Getter1 = getter1;
    local_58.Getter2 = getter2;
    local_58.Transformer = transformer;
    local_58.Col = col;
    local_58.Weight = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<long_long>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>>
              (&local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar8 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar8 = getter1->Count;
    }
    if (0 < iVar8) {
      iVar9 = 0;
      local_60 = 0.0;
      local_70 = col;
      local_6c = line_weight;
      local_68 = DrawList;
      do {
        iVar3 = getter1->Count;
        iVar4 = transformer->YAxis;
        pIVar5 = GImPlot->CurrentPlot;
        dVar2 = (pIVar5->XAxis).Range.Min;
        fVar12 = (float)(((getter1->XScale * local_60 + getter1->X0) - dVar2) * GImPlot->Mx +
                        (double)GImPlot->PixelRange[iVar4].Min.x);
        fVar11 = (float)(((double)*(long *)((long)getter1->Ys +
                                           (long)(((getter1->Offset + iVar9) % iVar3 + iVar3) %
                                                 iVar3) * (long)getter1->Stride) -
                         pIVar5->YAxis[iVar4].Range.Min) * GImPlot->My[iVar4] +
                        (double)GImPlot->PixelRange[iVar4].Min.y);
        local_58.Getter1 = (GetterYs<long_long> *)CONCAT44(fVar11,fVar12);
        local_78.x = (float)(((getter2->XScale * local_60 + getter2->X0) - dVar2) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[iVar4].Min.x);
        fVar10 = (float)((getter2->YRef - pIVar5->YAxis[iVar4].Range.Min) * GImPlot->My[iVar4] +
                        (double)GImPlot->PixelRange[iVar4].Min.y);
        local_78.y = fVar10;
        pIVar5 = pIVar7->CurrentPlot;
        fVar6 = fVar11;
        if (fVar10 <= fVar11) {
          fVar6 = fVar10;
        }
        if ((fVar6 < (pIVar5->PlotRect).Max.y) &&
           (fVar6 = (float)(~-(uint)(fVar10 <= fVar11) & (uint)fVar10 |
                           (uint)fVar11 & -(uint)(fVar10 <= fVar11)),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar6 && fVar6 != *pfVar1)) {
          fVar6 = fVar12;
          if (local_78.x <= fVar12) {
            fVar6 = local_78.x;
          }
          if ((fVar6 < (pIVar5->PlotRect).Max.x) &&
             (fVar6 = (float)(~-(uint)(local_78.x <= fVar12) & (uint)local_78.x |
                             (uint)fVar12 & -(uint)(local_78.x <= fVar12)),
             (pIVar5->PlotRect).Min.x <= fVar6 && fVar6 != (pIVar5->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)&local_58,&local_78,col,line_weight);
            DrawList = local_68;
            line_weight = local_6c;
            col = local_70;
          }
        }
        local_60 = local_60 + 1.0;
        iVar9 = iVar9 + 1;
      } while (iVar8 != iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}